

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_views.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBViewsInit(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  *in_RSI;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  ClientContext *in_stack_00000028;
  reference_wrapper<duckdb::SchemaCatalogEntry> *schema;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__range1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  templated_unique_single_t result;
  SchemaCatalogEntry *in_stack_ffffffffffffff48;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  *in_stack_ffffffffffffff50;
  anon_class_8_1_6971b95b *__f;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> this;
  anon_class_8_1_6971b95b local_88 [4];
  reference local_68;
  reference_wrapper<duckdb::SchemaCatalogEntry> *local_60;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_38 [40];
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  *local_10;
  
  this._M_head_impl =
       (GlobalTableFunctionState *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  local_10 = in_RSI;
  make_uniq<duckdb::DuckDBViewsData>();
  Catalog::GetAllSchemas(in_stack_00000028);
  local_50 = local_38;
  local_58._M_current =
       (reference_wrapper<duckdb::SchemaCatalogEntry> *)
       ::std::
       vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ::begin((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                *)in_stack_ffffffffffffff48);
  local_60 = (reference_wrapper<duckdb::SchemaCatalogEntry> *)
             ::std::
             vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ::end((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
               ::operator*(&local_58);
    in_stack_ffffffffffffff48 = ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::get(local_68);
    __f = local_88;
    in_stack_ffffffffffffff50 = local_10;
    ::std::function<void(duckdb::CatalogEntry&)>::
    function<duckdb::DuckDBViewsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0,void>
              ((function<void_(duckdb::CatalogEntry_&)> *)this._M_head_impl,__f);
    (*(in_stack_ffffffffffffff48->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,3,__f);
    ::std::function<void_(duckdb::CatalogEntry_&)>::~function
              ((function<void_(duckdb::CatalogEntry_&)> *)0x1418f49);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
    ::operator++(&local_58);
  }
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::DuckDBViewsData,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::DuckDBViewsData,_std::default_delete<duckdb::DuckDBViewsData>_> *)
             in_stack_ffffffffffffff48);
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)0x1418fae);
  unique_ptr<duckdb::DuckDBViewsData,_std::default_delete<duckdb::DuckDBViewsData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DuckDBViewsData,_std::default_delete<duckdb::DuckDBViewsData>,_true>
               *)0x1418fbb);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBViewsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBViewsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::VIEW_ENTRY,
		                  [&](CatalogEntry &entry) { result->entries.push_back(entry); });
	};
	return std::move(result);
}